

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-semaphore.c
# Opt level: O1

void worker(void *arg)

{
  int iVar1;
  undefined8 uVar2;
  long *plVar3;
  uv_connect_t *puVar4;
  uv_shutdown_t *puVar5;
  int64_t eval_b;
  int64_t eval_a;
  void *pvStack_2e8;
  uv_shutdown_t auStack_2e0 [2];
  code *pcStack_1f0;
  code *pcStack_1e0;
  code *pcStack_1d8;
  uv_connect_t auStack_1c8 [2];
  code *pcStack_d0;
  long lStack_c8;
  long lStack_c0;
  long alStack_b8 [4];
  code *pcStack_98;
  long lStack_88;
  long alStack_80 [12];
  code *pcStack_20;
  undefined8 local_18;
  long local_10;
  
  if (*(int *)((long)arg + 0x48) != 0) {
    pcStack_20 = (code *)0x1ba5cd;
    uv_sleep();
  }
  pcStack_20 = (code *)0x1ba5d5;
  uv_mutex_lock(arg);
  local_10 = (long)*(int *)((long)arg + 0x4c);
  local_18 = 0;
  if (local_10 == 0) {
    pcStack_20 = (code *)0x1ba5fa;
    uv_sem_post((long)arg + 0x28);
    *(undefined4 *)((long)arg + 0x4c) = 1;
    uv_mutex_unlock(arg);
    return;
  }
  pcStack_20 = run_test_semaphore_2;
  worker_cold_1();
  plVar3 = alStack_80 + 7;
  alStack_80[10] = 0;
  alStack_80[8] = 0;
  alStack_80[9] = 0;
  alStack_80[6] = 0;
  alStack_80[7] = 0;
  alStack_80[4] = 0;
  alStack_80[5] = 0;
  alStack_80[2] = 0;
  alStack_80[3] = 0;
  alStack_80[0xb] = 100;
  pcStack_98 = (code *)0x1ba64d;
  pcStack_20 = (code *)arg;
  iVar1 = uv_sem_init(plVar3,0);
  alStack_80[0] = (long)iVar1;
  lStack_88 = 0;
  if (alStack_80[0] == 0) {
    pcStack_98 = (code *)0x1ba677;
    iVar1 = uv_mutex_init(alStack_80 + 2);
    alStack_80[0] = (long)iVar1;
    lStack_88 = 0;
    if (alStack_80[0] != 0) goto LAB_001ba720;
    pcStack_98 = (code *)0x1ba6ad;
    iVar1 = uv_thread_create(alStack_80,worker,alStack_80 + 2);
    lStack_88 = (long)iVar1;
    alStack_80[1] = 0;
    if (lStack_88 != 0) goto LAB_001ba72f;
    pcStack_98 = (code *)0x1ba6d1;
    uv_sem_wait(plVar3);
    pcStack_98 = (code *)0x1ba6db;
    iVar1 = uv_thread_join(alStack_80);
    lStack_88 = (long)iVar1;
    alStack_80[1] = 0;
    if (lStack_88 == 0) {
      pcStack_98 = (code *)0x1ba701;
      uv_mutex_destroy(alStack_80 + 2);
      pcStack_98 = (code *)0x1ba709;
      uv_sem_destroy(plVar3);
      return;
    }
  }
  else {
    pcStack_98 = (code *)0x1ba720;
    run_test_semaphore_2_cold_1();
LAB_001ba720:
    pcStack_98 = (code *)0x1ba72f;
    run_test_semaphore_2_cold_2();
LAB_001ba72f:
    pcStack_98 = (code *)0x1ba73e;
    run_test_semaphore_2_cold_3();
  }
  pcStack_98 = run_test_semaphore_3;
  run_test_semaphore_2_cold_4();
  pcStack_d0 = (code *)0x1ba761;
  pcStack_98 = (code *)plVar3;
  iVar1 = uv_sem_init(alStack_b8,3);
  lStack_c0 = (long)iVar1;
  lStack_c8 = 0;
  if (lStack_c0 == 0) {
    plVar3 = alStack_b8;
    pcStack_d0 = (code *)0x1ba78c;
    uv_sem_wait(plVar3);
    pcStack_d0 = (code *)0x1ba794;
    uv_sem_wait(plVar3);
    pcStack_d0 = (code *)0x1ba79c;
    iVar1 = uv_sem_trywait(plVar3);
    lStack_c0 = (long)iVar1;
    lStack_c8 = 0;
    if (lStack_c0 != 0) goto LAB_001ba850;
    lStack_c0 = -0xb;
    pcStack_d0 = (code *)0x1ba7cd;
    iVar1 = uv_sem_trywait(alStack_b8);
    lStack_c8 = (long)iVar1;
    if (lStack_c0 != lStack_c8) goto LAB_001ba85d;
    plVar3 = alStack_b8;
    pcStack_d0 = (code *)0x1ba7eb;
    uv_sem_post(plVar3);
    pcStack_d0 = (code *)0x1ba7f3;
    iVar1 = uv_sem_trywait(plVar3);
    lStack_c0 = (long)iVar1;
    lStack_c8 = 0;
    if (lStack_c0 != 0) goto LAB_001ba86a;
    lStack_c0 = -0xb;
    pcStack_d0 = (code *)0x1ba820;
    iVar1 = uv_sem_trywait(alStack_b8);
    lStack_c8 = (long)iVar1;
    if (lStack_c0 == lStack_c8) {
      pcStack_d0 = (code *)0x1ba83b;
      uv_sem_destroy(alStack_b8);
      return;
    }
  }
  else {
    pcStack_d0 = (code *)0x1ba850;
    run_test_semaphore_3_cold_1();
LAB_001ba850:
    pcStack_d0 = (code *)0x1ba85d;
    run_test_semaphore_3_cold_2();
LAB_001ba85d:
    pcStack_d0 = (code *)0x1ba86a;
    run_test_semaphore_3_cold_3();
LAB_001ba86a:
    pcStack_d0 = (code *)0x1ba877;
    run_test_semaphore_3_cold_4();
  }
  pcStack_d0 = run_test_shutdown_close_tcp;
  run_test_semaphore_3_cold_5();
  pcStack_1d8 = (code *)0x1ba8a2;
  pcStack_d0 = (code *)plVar3;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&auStack_1c8[0].type);
  auStack_1c8[0].reserved[1] = (void *)(long)iVar1;
  auStack_1c8[0].data = (uv_loop_t *)0x0;
  if (auStack_1c8[0].reserved[1] == (void *)0x0) {
    pcStack_1d8 = (code *)0x1ba8c7;
    uVar2 = uv_default_loop();
    pcStack_1d8 = (code *)0x1ba8d4;
    iVar1 = uv_tcp_init(uVar2,auStack_1c8[0].reserved + 1);
    auStack_1c8[0].data = (void *)(long)iVar1;
    auStack_1c8[0].loop = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1c8[0].data != (uv_loop_t *)0x0) goto LAB_001baa3a;
    pcStack_1d8 = (code *)0x1ba911;
    iVar1 = uv_tcp_connect(&connect_req,auStack_1c8[0].reserved + 1,&auStack_1c8[0].type,connect_cb)
    ;
    auStack_1c8[0].data = (void *)(long)iVar1;
    auStack_1c8[0].loop = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1c8[0].data != (uv_loop_t *)0x0) goto LAB_001baa49;
    pcStack_1d8 = (code *)0x1ba936;
    uVar2 = uv_default_loop();
    pcStack_1d8 = (code *)0x1ba940;
    iVar1 = uv_run(uVar2,0);
    auStack_1c8[0].data = (void *)(long)iVar1;
    auStack_1c8[0].loop = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_1c8[0].data != (uv_loop_t *)0x0) goto LAB_001baa58;
    auStack_1c8[0].data = (uv_loop_t *)0x1;
    auStack_1c8[0].loop = (uv_loop_t *)(long)connect_cb_called;
    if (auStack_1c8[0].loop != (uv_loop_t *)0x1) goto LAB_001baa67;
    auStack_1c8[0].data = (uv_loop_t *)0x1;
    auStack_1c8[0].loop = (uv_loop_t *)(long)shutdown_cb_called;
    if (auStack_1c8[0].loop != (uv_loop_t *)0x1) goto LAB_001baa76;
    auStack_1c8[0].data = (uv_loop_t *)0x1;
    auStack_1c8[0].loop = (uv_loop_t *)(long)close_cb_called;
    if (auStack_1c8[0].loop != (uv_loop_t *)0x1) goto LAB_001baa85;
    pcStack_1d8 = (code *)0x1ba9d4;
    plVar3 = (long *)uv_default_loop();
    pcStack_1d8 = (code *)0x1ba9e8;
    uv_walk(plVar3,close_walk_cb,0);
    pcStack_1d8 = (code *)0x1ba9f2;
    uv_run(plVar3,0);
    auStack_1c8[0].data = (uv_loop_t *)0x0;
    pcStack_1d8 = (code *)0x1baa00;
    uVar2 = uv_default_loop();
    pcStack_1d8 = (code *)0x1baa08;
    iVar1 = uv_loop_close(uVar2);
    auStack_1c8[0].loop = (uv_loop_t *)(long)iVar1;
    if ((uv_loop_t *)auStack_1c8[0].data == auStack_1c8[0].loop) {
      pcStack_1d8 = (code *)0x1baa20;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_1d8 = (code *)0x1baa3a;
    run_test_shutdown_close_tcp_cold_1();
LAB_001baa3a:
    pcStack_1d8 = (code *)0x1baa49;
    run_test_shutdown_close_tcp_cold_2();
LAB_001baa49:
    pcStack_1d8 = (code *)0x1baa58;
    run_test_shutdown_close_tcp_cold_3();
LAB_001baa58:
    pcStack_1d8 = (code *)0x1baa67;
    run_test_shutdown_close_tcp_cold_4();
LAB_001baa67:
    pcStack_1d8 = (code *)0x1baa76;
    run_test_shutdown_close_tcp_cold_5();
LAB_001baa76:
    pcStack_1d8 = (code *)0x1baa85;
    run_test_shutdown_close_tcp_cold_6();
LAB_001baa85:
    pcStack_1d8 = (code *)0x1baa94;
    run_test_shutdown_close_tcp_cold_7();
  }
  puVar4 = auStack_1c8;
  iVar1 = (int)auStack_1c8 + 8;
  pcStack_1d8 = connect_cb;
  run_test_shutdown_close_tcp_cold_8();
  if (puVar4 == &connect_req) {
    pcStack_1d8 = (code *)(long)iVar1;
    pcStack_1e0 = (code *)0x0;
    if (pcStack_1d8 != (code *)0x0) goto LAB_001bab85;
    pcStack_1f0 = (code *)0x1baaf2;
    iVar1 = uv_shutdown(&shutdown_req,connect_req.handle,shutdown_cb);
    pcStack_1d8 = (code *)(long)iVar1;
    pcStack_1e0 = (code *)0x0;
    if (pcStack_1d8 != (code *)0x0) goto LAB_001bab94;
    pcStack_1f0 = (code *)0x1bab1e;
    iVar1 = uv_is_closing(connect_req.handle);
    pcStack_1d8 = (code *)(long)iVar1;
    pcStack_1e0 = (code *)0x0;
    if (pcStack_1d8 != (code *)0x0) goto LAB_001baba3;
    pcStack_1f0 = (code *)0x1bab4d;
    uv_close(connect_req.handle,close_cb);
    pcStack_1d8 = (code *)0x1;
    pcStack_1f0 = (code *)0x1bab62;
    iVar1 = uv_is_closing(connect_req.handle);
    pcStack_1e0 = (code *)(long)iVar1;
    if (pcStack_1d8 == pcStack_1e0) {
      connect_cb_called = connect_cb_called + 1;
      return;
    }
  }
  else {
    pcStack_1f0 = (code *)0x1bab85;
    connect_cb_cold_1();
LAB_001bab85:
    pcStack_1f0 = (code *)0x1bab94;
    connect_cb_cold_2();
LAB_001bab94:
    pcStack_1f0 = (code *)0x1baba3;
    connect_cb_cold_3();
LAB_001baba3:
    pcStack_1f0 = (code *)0x1babb2;
    connect_cb_cold_4();
  }
  pcStack_1f0 = run_test_shutdown_close_pipe;
  connect_cb_cold_5();
  pcStack_1f0 = (code *)plVar3;
  uVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar2,&auStack_2e0[0].loop,0);
  auStack_2e0[0].data = (void *)(long)iVar1;
  pvStack_2e8 = (void *)0x0;
  if (auStack_2e0[0].data == (void *)0x0) {
    uv_pipe_connect(&connect_req,&auStack_2e0[0].loop,"/tmp/uv-test-sock",connect_cb);
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    auStack_2e0[0].data = (void *)(long)iVar1;
    pvStack_2e8 = (void *)0x0;
    if (auStack_2e0[0].data != (void *)0x0) goto LAB_001bad25;
    auStack_2e0[0].data = (void *)0x1;
    pvStack_2e8 = (void *)(long)connect_cb_called;
    if (pvStack_2e8 != (void *)0x1) goto LAB_001bad34;
    auStack_2e0[0].data = (void *)0x1;
    pvStack_2e8 = (void *)(long)shutdown_cb_called;
    if (pvStack_2e8 != (void *)0x1) goto LAB_001bad43;
    auStack_2e0[0].data = (void *)0x1;
    pvStack_2e8 = (void *)(long)close_cb_called;
    if (pvStack_2e8 == (void *)0x1) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      auStack_2e0[0].data = (void *)0x0;
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      pvStack_2e8 = (void *)(long)iVar1;
      if (auStack_2e0[0].data == pvStack_2e8) {
        uv_library_shutdown();
        return;
      }
      goto LAB_001bad61;
    }
  }
  else {
    run_test_shutdown_close_pipe_cold_1();
LAB_001bad25:
    run_test_shutdown_close_pipe_cold_2();
LAB_001bad34:
    run_test_shutdown_close_pipe_cold_3();
LAB_001bad43:
    run_test_shutdown_close_pipe_cold_4();
  }
  run_test_shutdown_close_pipe_cold_5();
LAB_001bad61:
  puVar5 = auStack_2e0;
  iVar1 = (int)&pvStack_2e8;
  run_test_shutdown_close_pipe_cold_6();
  if (puVar5 == &shutdown_req) {
    if ((iVar1 == -0x7d) || (iVar1 == 0)) {
      shutdown_cb_called = shutdown_cb_called + 1;
      return;
    }
  }
  else {
    shutdown_cb_cold_1();
  }
  shutdown_cb_cold_2();
  close_cb_called = close_cb_called + 1;
  return;
}

Assistant:

static void worker(void* arg) {
  worker_config* c = arg;

  if (c->delay)
    uv_sleep(c->delay);

  uv_mutex_lock(&c->mutex);
  ASSERT_OK(c->posted);
  uv_sem_post(&c->sem);
  c->posted = 1;
  uv_mutex_unlock(&c->mutex);
}